

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O2

void __thiscall
Centaurus::NFABase<Centaurus::LDFAState<char>_>::print
          (NFABase<Centaurus::LDFAState<char>_> *this,wostream *os,wstring *graph_name)

{
  uint uVar1;
  wostream *pwVar2;
  pointer pLVar3;
  pointer pLVar4;
  ulong uVar5;
  
  pwVar2 = std::operator<<(os,L"digraph ");
  pwVar2 = std::operator<<(pwVar2,(wstring *)graph_name);
  pwVar2 = std::operator<<(pwVar2,L" {");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<(os,L"rankdir=\"LR\";");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<(os,L"graph [ charset=\"UTF-8\", style=\"filled\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<(os,L"node [ style=\"solid,filled\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  pwVar2 = std::operator<<(os,L"edge [ style=\"solid\" ];");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  uVar1 = 0;
  while( true ) {
    pLVar4 = (this->m_states).
             super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar3 = (this->m_states).
             super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pLVar3 - (long)pLVar4) / 0x50) <= (ulong)uVar1) break;
    pwVar2 = std::operator<<(os,L"S");
    pwVar2 = std::wostream::_M_insert<unsigned_long>((ulong)pwVar2);
    std::operator<<(pwVar2,L" [ label=\"");
    (*this->_vptr_NFABase[2])(this,os,(ulong)uVar1);
    pwVar2 = std::operator<<(os,L"\", shape=circle ];");
    std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
    uVar1 = uVar1 + 1;
  }
  uVar1 = 0;
  while( true ) {
    uVar5 = (ulong)uVar1;
    if ((ulong)(((long)pLVar3 - (long)pLVar4) / 0x50) <= uVar5) break;
    (*pLVar4[uVar5].
      super_NFABaseState<char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
      ._vptr_NFABaseState[2])(pLVar4 + uVar5,os,uVar5);
    pLVar4 = (this->m_states).
             super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar3 = (this->m_states).
             super__Vector_base<Centaurus::LDFAState<char>,_std::allocator<Centaurus::LDFAState<char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar1 = uVar1 + 1;
  }
  pwVar2 = std::operator<<(os,L"}");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar2);
  return;
}

Assistant:

virtual void print(std::wostream& os, const std::wstring& graph_name) const
	{
		os << L"digraph " << graph_name << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\", style=\"filled\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			os << L"S" << i << L" [ label=\"";
			print_state(os, i);
			os << L"\", shape=circle ];" << std::endl;
		}

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			m_states[i].print(os, i);
		}

		os << L"}" << std::endl;
	}